

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_nn_predict_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1e0b8ad::NnPredictTest_DISABLED_Speed_Test::TestBody
          (NnPredictTest_DISABLED_Speed_Test *this)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  NnPredictTest_DISABLED_Speed_Test *pNVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  uint *__src;
  float **ppfVar7;
  long lVar8;
  float **ppfVar9;
  long lVar10;
  int iVar11;
  byte bVar12;
  double dVar13;
  double dVar14;
  aom_usec_timer timer;
  NN_CONFIG nn_config;
  float outputs_test [128];
  float outputs_ref [128];
  float inputs [128];
  timeval local_7a0;
  timeval local_790;
  NnPredictTest_DISABLED_Speed_Test *local_780;
  float **local_778;
  float **local_770;
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  uint *local_738;
  long local_730;
  undefined4 *local_728;
  NN_CONFIG local_720;
  float local_638 [128];
  float local_438 [128];
  float local_238 [130];
  
  bVar12 = 0;
  local_770 = (this->super_NnPredictTest).weights;
  local_778 = (this->super_NnPredictTest).bias;
  local_728 = &DAT_00cd263c;
  lVar10 = 0;
  local_780 = this;
  do {
    pNVar3 = local_780;
    __src = &(anonymous_namespace)::kShapes + lVar10 * 0x3a;
    local_730 = lVar10;
    memset(local_238,0,0x200);
    memset(local_638,0,0x200);
    memset(local_438,0,0x200);
    memcpy(&local_720,__src,0xe8);
    ppfVar7 = local_770;
    ppfVar9 = local_720.weights;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *ppfVar9 = *ppfVar7;
      ppfVar7 = ppfVar7 + (ulong)bVar12 * -2 + 1;
      ppfVar9 = ppfVar9 + (ulong)bVar12 * -2 + 1;
    }
    ppfVar7 = local_778;
    ppfVar9 = local_720.bias;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *ppfVar9 = *ppfVar7;
      ppfVar7 = ppfVar7 + (ulong)bVar12 * -2 + 1;
      ppfVar9 = ppfVar9 + (ulong)bVar12 * -2 + 1;
    }
    gettimeofday(&local_7a0,(__timezone_ptr_t)0x0);
    iVar11 = 10000000;
    do {
      av1_nn_predict_c(local_238,&local_720,0,local_438);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    gettimeofday(&local_790,(__timezone_ptr_t)0x0);
    _Var2 = local_790.tv_usec;
    _Var1 = local_790.tv_sec;
    local_748 = local_7a0.tv_sec;
    local_740 = local_7a0.tv_usec;
    gettimeofday(&local_7a0,(__timezone_ptr_t)0x0);
    iVar11 = 10000000;
    do {
      (*(pNVar3->super_NnPredictTest).target_func_)(local_238,&local_720,0,local_638);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    gettimeofday(&local_790,(__timezone_ptr_t)0x0);
    local_758 = local_790.tv_sec;
    local_768 = local_7a0.tv_sec;
    local_760 = local_7a0.tv_usec;
    local_750 = local_790.tv_usec;
    printf("%d",(ulong)*__src);
    puVar4 = local_728;
    iVar11 = (&DAT_00cd2638)[lVar10 * 0x3a];
    local_738 = __src;
    if (0 < (long)iVar11) {
      lVar10 = 0;
      do {
        printf("x%d",(ulong)(uint)puVar4[lVar10]);
        lVar10 = lVar10 + 1;
      } while (iVar11 != lVar10);
    }
    lVar5 = local_750 - local_760;
    lVar10 = lVar5 + 1000000;
    if (-1 < lVar5) {
      lVar10 = lVar5;
    }
    lVar8 = _Var2 - local_740;
    lVar6 = lVar8 + 1000000;
    if (-1 < lVar8) {
      lVar6 = lVar8;
    }
    dVar13 = (double)(lVar10 + ((lVar5 >> 0x3f) + (local_758 - local_768)) * 1000000);
    dVar14 = (double)(lVar6 + ((lVar8 >> 0x3f) + (_Var1 - local_748)) * 1000000);
    printf("x%d: ");
    printf("%7.2f/%7.2fns (%3.2f)\n",dVar14,dVar13,dVar14 / dVar13);
    lVar10 = local_730 + 1;
    local_728 = puVar4 + 0x3a;
  } while (lVar10 != 0x11);
  return;
}

Assistant:

TEST_P(NnPredictTest, DISABLED_Speed) {
  RunNnPredictSpeedTest_all(kShapes, sizeof(kShapes) / sizeof(kShapes[0]),
                            10000000);
}